

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

int __thiscall
unodb::detail::
basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::init(basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
       *this,EVP_PKEY_CTX *ctx)

{
  byte new_value;
  bool bVar1;
  int extraout_EAX;
  reference pvVar2;
  basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *leaf;
  reference this_00;
  basic_node_ptr<unodb::detail::olc_node_header> new_value_00;
  reference this_01;
  byte in_CL;
  olc_inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *in_RDX;
  basic_node_ptr<unodb::detail::olc_node_header> local_68;
  basic_node_ptr<unodb::detail::olc_node_header> child_ptr;
  uint child_i;
  uint8_t next_child;
  basic_node_ptr<unodb::detail::olc_node_header> local_50;
  undefined1 local_48 [8];
  leaf_reclaimable_ptr r;
  db_inode_reclaimable_ptr<unodb::detail::olc_inode_256<unsigned_long,_std::span<const_std::byte>_>_>
  reclaim_source_node;
  uint8_t child_to_delete_local;
  inode256_type *source_node_local;
  db_type *db_instance_local;
  basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *this_local;
  
  basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
  ::
  make_db_inode_reclaimable_ptr<unodb::detail::olc_inode_256<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
            ((basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
              *)&r._M_t.
                 super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 .
                 super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_false>
             ,in_RDX,(db_type *)ctx);
  pvVar2 = std::
           array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_256UL>
           ::operator[](&(in_RDX->
                         super_olc_inode_256_parent<unsigned_long,_std::span<const_std::byte>_>).
                         children,(ulong)in_CL);
  local_50 = in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::
             load(pvVar2);
  leaf = basic_node_ptr<unodb::detail::olc_node_header>::
         ptr<unodb::detail::basic_leaf<unsigned_long,unodb::detail::olc_node_header>*>(&local_50);
  basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>
  ::reclaim_leaf_on_scope_exit
            ((basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>
              *)local_48,leaf,(db_type *)ctx);
  basic_node_ptr<unodb::detail::olc_node_header>::basic_node_ptr
            ((basic_node_ptr<unodb::detail::olc_node_header> *)&child_i,(nullptr_t)0x0);
  pvVar2 = std::
           array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_256UL>
           ::operator[](&(in_RDX->
                         super_olc_inode_256_parent<unsigned_long,_std::span<const_std::byte>_>).
                         children,(ulong)in_CL);
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::operator=
            (pvVar2,_child_i);
  child_ptr.tagged_ptr._7_1_ = 0;
  for (child_ptr.tagged_ptr._0_4_ = 0; (uint)child_ptr.tagged_ptr < 0x100;
      child_ptr.tagged_ptr._0_4_ = (uint)child_ptr.tagged_ptr + 1) {
    pvVar2 = std::
             array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_256UL>
             ::operator[](&(in_RDX->
                           super_olc_inode_256_parent<unsigned_long,_std::span<const_std::byte>_>).
                           children,(ulong)(uint)child_ptr.tagged_ptr);
    local_68 = in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::
               load(pvVar2);
    bVar1 = basic_node_ptr<unodb::detail::olc_node_header>::operator==(&local_68,(nullptr_t)0x0);
    new_value = child_ptr.tagged_ptr._7_1_;
    if (!bVar1) {
      this_00 = std::array<unodb::in_critical_section<unsigned_char>,_256UL>::operator[]
                          (&this->child_indexes,(ulong)(uint)child_ptr.tagged_ptr);
      in_critical_section<unsigned_char>::operator=(this_00,new_value);
      pvVar2 = std::
               array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_256UL>
               ::operator[](&(in_RDX->
                             super_olc_inode_256_parent<unsigned_long,_std::span<const_std::byte>_>)
                             .children,(ulong)(uint)child_ptr.tagged_ptr);
      new_value_00 = in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                     ::load(pvVar2);
      this_01 = std::
                array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_48UL>
                ::operator[](&(this->children).pointer_array,(ulong)child_ptr.tagged_ptr._7_1_);
      in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::operator=
                (this_01,new_value_00);
      child_ptr.tagged_ptr._7_1_ = child_ptr.tagged_ptr._7_1_ + 1;
      if (child_ptr.tagged_ptr._7_1_ == 0x30) break;
    }
  }
  std::
  unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 *)local_48);
  std::
  unique_ptr<unodb::detail::olc_inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 *)&r._M_t.
                    super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                    .
                    super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>_*,_false>
               );
  return extraout_EAX;
}

Assistant:

constexpr void init(db_type &db_instance,
                      inode256_type &__restrict source_node,
                      std::uint8_t child_to_delete) noexcept {
    const auto reclaim_source_node{
        ArtPolicy::template make_db_inode_reclaimable_ptr<inode256_type>(
            &source_node, db_instance)};
    const auto r{ArtPolicy::reclaim_leaf_on_scope_exit(
        source_node.children[child_to_delete]
            .load()
            .template ptr<leaf_type *>(),
        db_instance)};

    source_node.children[child_to_delete] = node_ptr{nullptr};

    std::uint8_t next_child = 0;
    for (unsigned child_i = 0; child_i < 256; child_i++) {
      const auto child_ptr = source_node.children[child_i].load();
      if (child_ptr == nullptr) continue;

      child_indexes[child_i] = next_child;
      children.pointer_array[next_child] = source_node.children[child_i].load();
      ++next_child;

      if (next_child == basic_inode_48::capacity) return;
    }
  }